

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

int amqp_messenger_send_async
              (AMQP_MESSENGER_HANDLE messenger_handle,MESSAGE_HANDLE message,
              AMQP_MESSENGER_SEND_COMPLETE_CALLBACK on_user_defined_send_complete_callback,
              void *user_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  MESSAGE_HANDLE message_00;
  MESSAGE_SEND_CONTEXT *context;
  
  if ((message == (MESSAGE_HANDLE)0x0 || messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) ||
      on_user_defined_send_complete_callback == (AMQP_MESSENGER_SEND_COMPLETE_CALLBACK)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x45b;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_send_async",0x45a,1,
                "Invalid argument (messenger_handle=%p, message=%p, on_user_defined_send_complete_callback=%p)"
                ,messenger_handle,message,on_user_defined_send_complete_callback);
    }
  }
  else {
    message_00 = message_clone(message);
    if (message_00 == (MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x464;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"amqp_messenger_send_async",0x463,1,"Failed cloning AMQP message");
      }
    }
    else {
      context = (MESSAGE_SEND_CONTEXT *)calloc(1,0x38);
      if (context == (MESSAGE_SEND_CONTEXT *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_message_send_context",0x73,1,"Failed creating the message send context"
                   );
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_send_async",0x46d,1,
                    "Failed creating context for sending message");
        }
        message_destroy(message_00);
        iVar1 = 0x46f;
      }
      else {
        context->message = message_00;
        context->messenger = messenger_handle;
        context->on_send_complete_callback = on_user_defined_send_complete_callback;
        context->user_context = user_context;
        iVar1 = message_queue_add(messenger_handle->send_queue,message_00,
                                  on_message_processing_completed_callback,context);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"amqp_messenger_send_async",0x47a,1,"Failed adding message to send queue");
          }
          destroy_message_send_context(context);
          message_destroy(message_00);
          iVar1 = 0x47d;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int amqp_messenger_send_async(AMQP_MESSENGER_HANDLE messenger_handle, MESSAGE_HANDLE message, AMQP_MESSENGER_SEND_COMPLETE_CALLBACK on_user_defined_send_complete_callback, void* user_context)
{
    int result;

    if (messenger_handle == NULL || message == NULL || on_user_defined_send_complete_callback == NULL)
    {
        LogError("Invalid argument (messenger_handle=%p, message=%p, on_user_defined_send_complete_callback=%p)", messenger_handle, message, on_user_defined_send_complete_callback);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_HANDLE cloned_message;

        if ((cloned_message = message_clone(message)) == NULL)
        {
            LogError("Failed cloning AMQP message");
            result = MU_FAILURE;
        }
        else
        {
            MESSAGE_SEND_CONTEXT* message_context;
            AMQP_MESSENGER_INSTANCE *instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

            if ((message_context = create_message_send_context()) == NULL)
            {
                LogError("Failed creating context for sending message");
                message_destroy(cloned_message);
                result = MU_FAILURE;
            }
            else
            {
                message_context->message = cloned_message;
                message_context->messenger = instance;
                message_context->on_send_complete_callback = on_user_defined_send_complete_callback;
                message_context->user_context = user_context;

                if (message_queue_add(instance->send_queue, (MQ_MESSAGE_HANDLE)cloned_message, on_message_processing_completed_callback, (void*)message_context) != RESULT_OK)
                {
                    LogError("Failed adding message to send queue");
                    destroy_message_send_context(message_context);
                    message_destroy(cloned_message);
                    result = MU_FAILURE;
                }
                else
                {
                    result = RESULT_OK;
                }
            }
        }
    }

    return result;
}